

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void return_pocklestatus(strbuf *out,PockleStatus status)

{
  PockleStatus status_local;
  strbuf *out_local;
  
  switch(status) {
  case POCKLE_OK:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_OK");
    break;
  case POCKLE_SMALL_PRIME_NOT_SMALL:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_SMALL_PRIME_NOT_SMALL");
    break;
  case POCKLE_SMALL_PRIME_NOT_PRIME:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_SMALL_PRIME_NOT_PRIME");
    break;
  case POCKLE_PRIME_SMALLER_THAN_2:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_PRIME_SMALLER_THAN_2");
    break;
  case POCKLE_FACTOR_NOT_KNOWN_PRIME:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_FACTOR_NOT_KNOWN_PRIME");
    break;
  case POCKLE_FACTOR_NOT_A_FACTOR:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_FACTOR_NOT_A_FACTOR");
    break;
  case POCKLE_PRODUCT_OF_FACTORS_TOO_SMALL:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_PRODUCT_OF_FACTORS_TOO_SMALL");
    break;
  case POCKLE_FERMAT_TEST_FAILED:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_FERMAT_TEST_FAILED");
    break;
  case POCKLE_DISCRIMINANT_IS_SQUARE:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_DISCRIMINANT_IS_SQUARE");
    break;
  case POCKLE_WITNESS_POWER_IS_1:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_WITNESS_POWER_IS_1");
    break;
  case POCKLE_WITNESS_POWER_NOT_COPRIME:
    BinarySink_put_fmt(out->binarysink_,"%s\n","POCKLE_WITNESS_POWER_NOT_COPRIME");
    break;
  default:
    BinarySink_put_fmt(out->binarysink_,"POCKLE_BAD_STATUS_VALUE\n");
  }
  return;
}

Assistant:

static void return_pocklestatus(strbuf *out, PockleStatus status)
{
    switch (status) {
      default:
        put_fmt(out, "POCKLE_BAD_STATUS_VALUE\n");
        break;

#define STATUS_CASE(id)                         \
      case id:                                  \
        put_fmt(out, "%s\n", #id);          \
        break;

        POCKLE_STATUSES(STATUS_CASE);

#undef STATUS_CASE

    }
}